

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void OpenSteer::checkForDrawError(char *locationDescription)

{
  anon_unknown.dwarf_1485b::checkForGLError(locationDescription);
  return;
}

Assistant:

void 
OpenSteer::checkForDrawError (const char * locationDescription)
{
    checkForGLError (locationDescription);
}